

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  byte bVar1;
  uint uVar2;
  sqlite3 *psVar3;
  char *pKey;
  ExprList *pEVar4;
  bool bVar5;
  CollSeq *pColl;
  sqlite3 *psVar6;
  CollSeq *pCVar7;
  Expr *pEVar8;
  uint uVar9;
  long lVar10;
  
  psVar3 = pParse->db;
  pColl = (CollSeq *)0x0;
  do {
    if (pExpr == (Expr *)0x0) break;
    uVar2 = pExpr->flags;
    bVar5 = true;
    if ((uVar2 >> 9 & 1) == 0) {
      bVar1 = pExpr->op;
      if (bVar1 < 0x98) {
        if (bVar1 == 0x25) goto switchD_0015c88d_caseD_4;
        if (bVar1 == 0x3d) goto switchD_0015c88d_caseD_0;
        if (bVar1 == 0x5e) goto LAB_0015c8c3;
      }
      else {
        uVar9 = bVar1 - 0x98;
        switch(uVar9) {
        case 0:
        case 2:
switchD_0015c88d_caseD_0:
          if (pExpr->pTab != (Table *)0x0) {
            if (-1 < (long)pExpr->iColumn) {
              pKey = pExpr->pTab->aCol[pExpr->iColumn].zColl;
              bVar1 = psVar3->enc;
              psVar6 = psVar3;
              if (pKey != (char *)0x0) {
                psVar6 = (sqlite3 *)findElementWithHash(&psVar3->aCollSeq,pKey,(uint *)0x0);
              }
              pColl = psVar6->pDfltColl + ((ulong)bVar1 - 1);
              if (psVar6->pDfltColl == (CollSeq *)0x0) {
                pColl = (CollSeq *)0x0;
              }
            }
            goto LAB_0015c99e;
          }
          break;
        case 4:
switchD_0015c88d_caseD_4:
          pExpr = pExpr->pLeft;
LAB_0015c993:
          bVar5 = false;
          goto LAB_0015c99e;
        case 5:
          if (pExpr->op2 == '^') {
LAB_0015c8c3:
            pColl = sqlite3GetCollSeq(pParse,psVar3->enc,(CollSeq *)0x0,(pExpr->u).zToken);
            goto LAB_0015c99e;
          }
          if (((uVar9 < 6) && ((0x25U >> (uVar9 & 0x1f) & 1) != 0)) || (bVar1 == 0x3d))
          goto switchD_0015c88d_caseD_0;
        }
      }
      if ((uVar2 >> 8 & 1) != 0) {
        pEVar8 = pExpr->pLeft;
        if ((pEVar8 == (Expr *)0x0) || ((pEVar8->flags & 0x100) == 0)) {
          pEVar8 = pExpr->pRight;
          pEVar4 = (pExpr->x).pList;
          if (((uVar2 >> 0xb & 1) == 0 && pEVar4 != (ExprList *)0x0) && (0 < (long)pEVar4->nExpr)) {
            lVar10 = 0;
            do {
              pExpr = *(Expr **)((long)&pEVar4->a[0].pExpr + lVar10);
              if ((pExpr->flags & 0x100) != 0) goto LAB_0015c993;
              lVar10 = lVar10 + 0x20;
            } while ((long)pEVar4->nExpr * 0x20 != lVar10);
          }
        }
        bVar5 = false;
        pExpr = pEVar8;
      }
    }
LAB_0015c99e:
  } while (!bVar5);
  if (((pColl != (CollSeq *)0x0) &&
      (pColl->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) &&
     (pCVar7 = sqlite3GetCollSeq(pParse,pParse->db->enc,pColl,pColl->zName),
     pCVar7 == (CollSeq *)0x0)) {
    pColl = (CollSeq *)0x0;
  }
  return pColl;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( p->flags & EP_Generic ) break;
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_COLLATE || (op==TK_REGISTER && p->op2==TK_COLLATE) ){
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( (op==TK_AGG_COLUMN || op==TK_COLUMN
          || op==TK_REGISTER || op==TK_TRIGGER)
     && p->pTab!=0
    ){
      /* op==TK_REGISTER && p->pTab!=0 happens when pExpr was originally
      ** a TK_COLUMN but was previously evaluated and cached in a register */
      int j = p->iColumn;
      if( j>=0 ){
        const char *zColl = p->pTab->aCol[j].zColl;
        pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
      }
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( p->x.pList==0 || p->pRight==0 );
        /* p->flags holds EP_Collate and p->pLeft->flags does not.  And
        ** p->x.pSelect cannot.  So if p->x.pLeft exists, it must hold at
        ** least one EP_Collate. Thus the following two ALWAYS. */
        if( p->x.pList!=0 && ALWAYS(!ExprHasProperty(p, EP_xIsSelect)) ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){ 
    pColl = 0;
  }
  return pColl;
}